

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

Identifier * __thiscall
SymbolTable::getUniqueLabelName(Identifier *__return_storage_ptr__,SymbolTable *this,bool local)

{
  pair<std::_Rb_tree_const_iterator<Identifier>,_bool> pVar1;
  string local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  string local_b8;
  Identifier local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_t local_48;
  undefined1 local_40 [8];
  string name;
  bool local_local;
  SymbolTable *this_local;
  
  local_48 = this->uniqueCount;
  this->uniqueCount = local_48 + 1;
  name.field_2._M_local_buf[0xf] = local;
  tinyformat::format<unsigned_long>((string *)local_40,"__armips_label_%08x__",&local_48);
  if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::operator+(&local_68,"@@",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::string((string *)&local_b8,(string *)local_40);
  Identifier::Identifier(&local_98,&local_b8);
  pVar1 = std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::insert
                    (&this->generatedLabels,&local_98);
  local_c8 = (_Base_ptr)pVar1.first._M_node;
  local_c0 = pVar1.second;
  Identifier::~Identifier(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_e8,(string *)local_40);
  Identifier::Identifier(__return_storage_ptr__,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Identifier SymbolTable::getUniqueLabelName(bool local)
{
	std::string name = tfm::format("__armips_label_%08x__",uniqueCount++);
	if (local)
		name = "@@" + name;

	generatedLabels.insert(Identifier(name));
	return Identifier(name);
}